

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O2

Int __thiscall ipx::Maxvolume::Driver(Maxvolume *this,Basis *basis,Slice *slice)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  IndexedVector *lhs;
  IndexedVector *row;
  Vector *rhs;
  int iVar1;
  int iVar2;
  Int jb;
  pointer piVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  const_reference cVar7;
  bool bVar8;
  Int IVar9;
  uint uVar10;
  Model *pMVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  char *this_01;
  ulong uVar15;
  Basis *this_02;
  Int ii;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  size_type sVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  initializer_list<int> __l;
  double weight_recomp;
  uint local_cc;
  vector<int,_std::allocator<int>_> candidates;
  anon_class_16_2_b7367452 sum_used;
  bool exchanged;
  
  pMVar11 = Basis::model(basis);
  uVar18 = pMVar11->num_rows_;
  iVar1 = pMVar11->num_cols_;
  dVar22 = (this->control_->parameters_).super_ipx_parameters.volume_tol;
  local_cc = (this->control_->parameters_).super_ipx_parameters.maxskip_updates;
  this_00 = &slice->tblrow_used;
  row = &slice->row;
  sVar19 = 0;
  uVar16 = 0;
  if (0 < (int)uVar18) {
    uVar16 = (ulong)uVar18;
  }
  for (; uVar16 != sVar19; sVar19 = sVar19 + 1) {
    cVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar19);
    dVar20 = 0.0;
    if (cVar7) {
      dVar20 = (slice->invscale_basic)._M_data[sVar19];
    }
    (slice->work)._M_data[sVar19] = dVar20;
  }
  rhs = &slice->work;
  Basis::SolveDense(basis,rhs,rhs,'T');
  uVar18 = iVar1 + uVar18;
  uVar17 = 0;
  uVar16 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar16 = uVar17;
  }
  for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
    dVar20 = (slice->colscale)._M_data[uVar17];
    dVar21 = 0.0;
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      dVar21 = DotColumn(&pMVar11->AI_,(Int)uVar17,rhs);
      dVar21 = dVar21 * (slice->colscale)._M_data[uVar17];
    }
    (slice->colweights)._M_data[uVar17] = dVar21;
  }
  dVar20 = 1.0;
  if (1.0 <= dVar22) {
    dVar20 = dVar22;
  }
  lhs = &slice->lhs;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  uVar18 = 0;
  do {
    while( true ) {
      if (candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar10 = (uint)(slice->colweights)._M_size;
        uVar17 = 0;
        uVar16 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar16 = uVar17;
        }
        dVar22 = 0.0;
        dVar21 = 0.0;
        uVar15 = 0;
        uVar13 = 0;
        for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
          dVar24 = ABS((slice->colweights)._M_data[uVar17]);
          if (dVar24 <= dVar21) {
            uVar14 = uVar13;
            if (dVar22 < dVar24) {
              uVar15 = uVar17 & 0xffffffff;
              dVar22 = dVar24;
            }
          }
          else {
            uVar14 = uVar17 & 0xffffffff;
            uVar15 = uVar13;
            dVar22 = dVar21;
            dVar21 = dVar24;
          }
          uVar13 = uVar14;
        }
        sum_used.tblrow_used =
             (vector<bool,_std::allocator<bool>_> *)CONCAT44((int)uVar13,(int)uVar15);
        __l._M_len = 2;
        __l._M_array = (iterator)&sum_used;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&exchanged,__l,
                   (allocator_type *)&weight_recomp);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&candidates,(_Vector_base<int,_std::allocator<int>_> *)&exchanged);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&exchanged);
      }
      iVar1 = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      dVar22 = (slice->colweights)._M_data[iVar1];
      if (((dVar22 == 0.0) && (IVar9 = 0, !NAN(dVar22))) ||
         (IVar9 = Control::InterruptCheck(this->control_,-1), IVar9 != 0)) goto LAB_00385501;
      this_02 = basis;
      Basis::SolveForUpdate(basis,iVar1,lhs);
      IVar9 = ScaleFtran((Maxvolume *)this_02,(slice->colscale)._M_data[iVar1],
                         &slice->invscale_basic,lhs);
      sVar19 = (size_type)IVar9;
      dVar22 = ABS((slice->lhs).elements_._M_data[sVar19]);
      if (dVar22 <= dVar20) break;
      weight_recomp = 0.0;
      sum_used.weight_recomp = &weight_recomp;
      sum_used.tblrow_used = this_00;
      bVar8 = IndexedVector::sparse(lhs);
      if (bVar8) {
        piVar3 = (slice->lhs).pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (slice->lhs).nnz_;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        for (uVar16 = 0; uVar10 != uVar16; uVar16 = uVar16 + 1) {
          iVar2 = piVar3[uVar16];
          Driver::anon_class_16_2_b7367452::operator()
                    (&sum_used,iVar2,(slice->lhs).elements_._M_data[iVar2]);
        }
      }
      else {
        uVar10 = (uint)(lhs->elements_)._M_size;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        for (uVar16 = 0; uVar10 != uVar16; uVar16 = uVar16 + 1) {
          Driver::anon_class_16_2_b7367452::operator()
                    (&sum_used,(Int)uVar16,(slice->lhs).elements_._M_data[uVar16]);
        }
      }
      jb = (basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[sVar19];
      Basis::TableauRow(basis,jb,lhs,row,true);
      dVar21 = (slice->row).elements_._M_data[iVar1];
      if (ABS(dVar21) < 0.001) {
        poVar12 = Control::Debug(this->control_,3);
        this_01 = " |pivot| ";
        poVar12 = std::operator<<(poVar12," |pivot| ");
        sci2_abi_cxx11_((string *)&exchanged,(ipx *)this_01,ABS(dVar21));
        poVar12 = std::operator<<(poVar12,(string *)&exchanged);
        std::operator<<(poVar12,"(maxvolume)\n");
        std::__cxx11::string::~string((string *)&exchanged);
      }
      IVar9 = Basis::ExchangeIfStable(basis,jb,iVar1,dVar21,0,&exchanged);
      if (IVar9 != 0) goto LAB_00385501;
      if (exchanged == true) {
        this->updates_ = this->updates_ + 1;
        dVar22 = log2(dVar22);
        this->volinc_ = dVar22 + this->volinc_;
        pdVar4 = (slice->colscale)._M_data;
        pdVar5 = (slice->invscale_basic)._M_data;
        dVar22 = pdVar4[iVar1];
        dVar24 = pdVar5[sVar19];
        pdVar4[jb] = 1.0 / dVar24;
        pdVar5[sVar19] = 1.0 / pdVar4[iVar1];
        pdVar4[iVar1] = 0.0;
        cVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar19);
        dVar23 = (double)cVar7 - weight_recomp;
        bVar8 = IndexedVector::sparse(row);
        dVar23 = dVar23 / (dVar21 * dVar22);
        pdVar4 = (slice->row).elements_._M_data;
        pdVar5 = (slice->colscale)._M_data;
        pdVar6 = (slice->colweights)._M_data;
        if (bVar8) {
          piVar3 = (slice->row).pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = (slice->row).nnz_;
          uVar16 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar16 = 0;
          }
          for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
            iVar2 = piVar3[uVar17];
            pdVar6[iVar2] = pdVar4[iVar2] * dVar23 * pdVar5[iVar2] + pdVar6[iVar2];
          }
        }
        else {
          uVar10 = (uint)(row->elements_)._M_size;
          uVar16 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar16 = 0;
          }
          for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
            pdVar6[uVar17] = pdVar4[uVar17] * dVar23 * pdVar5[uVar17] + pdVar6[uVar17];
          }
        }
        cVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar19);
        pdVar4 = (slice->colweights)._M_data;
        pdVar4[jb] = dVar23 / dVar24 + (double)cVar7;
        pdVar4[iVar1] = 0.0;
        if (candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start) {
          candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
      }
    }
    (slice->colweights)._M_data[iVar1] = 0.0;
    (slice->colscale)._M_data[iVar1] = 0.0;
    candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    uVar10 = uVar18 + 1;
    bVar8 = uVar18 < local_cc;
    IVar9 = 0;
    uVar18 = uVar10;
  } while (bVar8);
LAB_00385501:
  this->skipped_ = this->skipped_ + uVar18;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&candidates.super__Vector_base<int,_std::allocator<int>_>);
  return IVar9;
}

Assistant:

Int Maxvolume::Driver(Basis& basis, Slice& slice) {
    const Model& model = basis.model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    Int errflag = 0;

    const double volumetol = std::max(control_.volume_tol(), 1.0);
    const Int maxskip = control_.maxskip_updates();

    Vector& colscale = slice.colscale;
    Vector& invscale_basic = slice.invscale_basic;
    const std::vector<bool>& tblrow_used = slice.tblrow_used;
    Vector& colweights = slice.colweights;
    IndexedVector& lhs = slice.lhs;
    IndexedVector& row = slice.row;
    Vector& work = slice.work;

    // Compute column weights.
    for (Int p = 0; p < m; p++)
        work[p] = tblrow_used[p] ? invscale_basic[p] : 0.0;
    basis.SolveDense(work, work, 'T');
    for (Int j = 0; j < n+m; j++) {
        if (colscale[j]) {
            assert(basis.StatusOf(j) == Basis::NONBASIC);
            double sum = DotColumn(AI, j, work);
            colweights[j] = sum * colscale[j];
        }
        else
            colweights[j] = 0.0;
    }

    std::vector<Int> candidates;
    Int skipped = 0;
    while (true) {
        // Pick column with maximum weight.
        if (candidates.empty()) {
            candidates = FindLargest(colweights);
            assert(!candidates.empty());
        }
        Int jn = candidates.back();
        assert(jn >= 0 && jn < n+m);
        const double weight = colweights[jn];
        if (weight == 0.0)
            break;
        assert(basis.StatusOf(jn) == Basis::NONBASIC);
        assert(colscale[jn] > 0.0);

        if ((errflag = control_.InterruptCheck()) != 0)
            break;

        // Find maximum scaled FTRAN entry.
        basis.SolveForUpdate(jn, lhs);
        const Int pmax = ScaleFtran(colscale[jn], invscale_basic, lhs);
        const double scaled_pivot = lhs[pmax];
        const double vmax = std::abs(scaled_pivot);

        // Skip the column if exchange does not increase volume enough.
        if (vmax <= volumetol) {
            colweights[jn] = 0.0;
            colscale[jn] = 0.0;
            candidates.pop_back();
            if (++skipped > maxskip && maxskip >= 0)
                break;
            continue;
        }

        // Recompute column weight from FTRAN.
        double weight_recomp = 0.0;
        auto sum_used =  [&](Int p, double x) {
            if (tblrow_used[p])
                weight_recomp += x;
        };
        for_each_nonzero(lhs, sum_used);
        assert(std::isfinite(weight_recomp));

        // Update basis.
        const Int jb = basis[pmax];
        basis.TableauRow(jb, lhs, row, true);
        const double pivot = row[jn];
        if (std::abs(pivot) < 1e-3) {
            control_.Debug(3)
                << " |pivot| " << sci2(std::abs(pivot))
                << "(maxvolume)\n";
        }
        bool exchanged;
        errflag = basis.ExchangeIfStable(jb, jn, pivot, 0, &exchanged);
        if (errflag)
            break;
        if (!exchanged)         // factorization was unstable, try again
            continue;
        updates_++;
        volinc_ += std::log2(vmax);

        // Update colscale and invscale_basic.
        const double dn = colscale[jn];
        const double dbinv = invscale_basic[pmax];
        assert(colscale[jb] == 0.0);
        colscale[jb] = 1.0 / invscale_basic[pmax];
        invscale_basic[pmax] = 1.0 / colscale[jn];
        colscale[jn] = 0.0;
        assert(std::isfinite(colscale[jb]));
        assert(std::isfinite(invscale_basic[pmax]));

        // Update column weights.
        const double alpha = (tblrow_used[pmax] - weight_recomp) / (dn*pivot);
        assert(std::isfinite(alpha));
        auto add = [&](Int j, double x) {
            colweights[j] += alpha * x * colscale[j];
        };
        for_each_nonzero(row, add);
        colweights[jb] = tblrow_used[pmax] + alpha/dbinv;
        colweights[jn] = 0.0;
        candidates.clear();
    }

    skipped_ += skipped;
    return errflag;
}